

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.c
# Opt level: O0

int mbedtls_asn1_get_int(uchar **p,uchar *end,int *val)

{
  ulong local_38;
  size_t len;
  uint *puStack_28;
  int ret;
  int *val_local;
  uchar *end_local;
  uchar **p_local;
  
  puStack_28 = (uint *)val;
  val_local = (int *)end;
  end_local = (uchar *)p;
  p_local._4_4_ = mbedtls_asn1_get_tag(p,end,&local_38,2);
  if (p_local._4_4_ == 0) {
    if ((local_38 < 5) && ((**(byte **)end_local & 0x80) == 0)) {
      *puStack_28 = 0;
      while (local_38 != 0) {
        *puStack_28 = *puStack_28 << 8 | (uint)**(byte **)end_local;
        *(long *)end_local = *(long *)end_local + 1;
        local_38 = local_38 - 1;
      }
      p_local._4_4_ = 0;
    }
    else {
      p_local._4_4_ = -100;
    }
  }
  return p_local._4_4_;
}

Assistant:

int mbedtls_asn1_get_int( unsigned char **p,
                  const unsigned char *end,
                  int *val )
{
    int ret;
    size_t len;

    if( ( ret = mbedtls_asn1_get_tag( p, end, &len, MBEDTLS_ASN1_INTEGER ) ) != 0 )
        return( ret );

    if( len > sizeof( int ) || ( **p & 0x80 ) != 0 )
        return( MBEDTLS_ERR_ASN1_INVALID_LENGTH );

    *val = 0;

    while( len-- > 0 )
    {
        *val = ( *val << 8 ) | **p;
        (*p)++;
    }

    return( 0 );
}